

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_endpoint_component_errors
          (dxt1_endpoint_optimizer *this,uint comp_index,uint64 (*error) [4] [256],
          uint64 (*best_remaining_error) [4])

{
  unique_color *puVar1;
  uchar *puVar2;
  uint64 uVar3;
  uint64 uVar4;
  ulong uVar5;
  uint64 *puVar6;
  uint64 uVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  uint64 *puVar11;
  long lVar12;
  ulong uVar13;
  uint64 *puVar14;
  ulong uVar15;
  long lVar16;
  uint64 uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  uint64 local_98 [6];
  uint64 WPP [4];
  uint64 WP2 [4];
  uint64 W [4];
  
  WPP[2] = 0;
  WPP[3] = 0;
  WPP[0] = 0;
  WPP[1] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  uVar18 = (ulong)(this->m_unique_colors).m_size;
  if (uVar18 != 0) {
    puVar1 = (this->m_unique_colors).m_p;
    puVar2 = (this->m_best_solution).m_selectors.m_p;
    uVar13 = 0;
    do {
      uVar15 = (ulong)puVar1[uVar13].m_color.field_0.c[comp_index];
      uVar9 = (ulong)puVar1[uVar13].m_weight;
      uVar5 = (ulong)puVar2[uVar13];
      WPP[uVar5 + 2] = WPP[uVar5 + 2] + uVar9;
      lVar10 = uVar9 * uVar15;
      local_98[uVar5 + 4] = local_98[uVar5 + 4] + lVar10 * 2;
      local_98[uVar5] = local_98[uVar5] + lVar10 * uVar15;
      uVar13 = uVar13 + 1;
    } while (uVar18 != uVar13);
  }
  bVar20 = comp_index == 1;
  puVar11 = WPP + 2;
  puVar6 = local_98 + 4;
  puVar14 = local_98;
  lVar10 = 0;
  bVar19 = true;
  do {
    bVar8 = bVar19;
    uVar7 = *puVar14;
    (*error)[lVar10][0] = uVar7;
    uVar3 = *puVar11;
    uVar4 = *puVar6;
    lVar12 = 1;
    uVar17 = uVar7;
    do {
      uVar18 = (ulong)(byte)((byte)lVar12 >> bVar20 * '\x02' + 2 | (byte)lVar12 << (bVar20 ^ 3U));
      uVar18 = (uVar3 * uVar18 - uVar4) * uVar18 + uVar7;
      (*error)[lVar10][lVar12] = uVar18;
      if (uVar17 <= uVar18) {
        uVar18 = uVar17;
      }
      lVar12 = lVar12 + 1;
      uVar17 = uVar18;
    } while ((ulong)bVar20 * 0x20 + 0x20 != lVar12);
    (*best_remaining_error)[lVar10] = uVar18;
    lVar10 = 1;
    puVar14 = local_98 + 1;
    puVar6 = local_98 + 5;
    puVar11 = WPP + 3;
    bVar19 = false;
  } while (bVar8);
  puVar11 = (*error)[2] + 1;
  lVar10 = 2;
  do {
    uVar7 = local_98[lVar10];
    (*error)[lVar10][0] = uVar7;
    uVar3 = WPP[lVar10 + 2];
    uVar18 = (uVar3 - local_98[lVar10 + 4]) + uVar7;
    lVar12 = uVar3 * 3 - local_98[lVar10 + 4];
    lVar16 = 0;
    do {
      puVar11[lVar16] = uVar18;
      if (uVar18 < uVar7) {
        uVar7 = uVar18;
      }
      uVar18 = uVar18 + lVar12;
      lVar16 = lVar16 + 1;
      lVar12 = lVar12 + uVar3 * 2;
    } while (lVar16 != 0xff);
    (*best_remaining_error)[lVar10] = uVar7;
    lVar10 = lVar10 + 1;
    puVar11 = puVar11 + 0x100;
  } while (lVar10 != 4);
  uVar7 = (*best_remaining_error)[3];
  lVar10 = 2;
  do {
    uVar7 = uVar7 + (*best_remaining_error)[lVar10];
    (*best_remaining_error)[lVar10] = uVar7;
    bVar19 = lVar10 != 0;
    lVar10 = lVar10 + -1;
  } while (bVar19);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_endpoint_component_errors(uint comp_index, uint64 (&error)[4][256], uint64 (&best_remaining_error)[4])
    {
        uint64 W[4] = {}, WP2[4] = {}, WPP[4] = {};
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            uint p = m_unique_colors[i].m_color[comp_index];
            uint w = m_unique_colors[i].m_weight;
            uint8 s = m_best_solution.m_selectors[i];
            W[s] += (int64)w;
            WP2[s] += (int64)w * p * 2;
            WPP[s] += (int64)w * p * p;
        }
        const uint comp_limit = comp_index == 1 ? 64 : 32;
        for (uint8 s = 0; s < 2; s++)
        {
            uint64 best_error = error[s][0] = WPP[s];
            for (uint8 c = 1; c < comp_limit; c++)
            {
                uint8 p = comp_index == 1 ? c << 2 | c >> 4 : c << 3 | c >> 2;
                error[s][c] = W[s] * p * p - WP2[s] * p + WPP[s];
                if (error[s][c] < best_error)
                {
                    best_error = error[s][c];
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 2; s < 4; s++)
        {
            uint64 best_error = error[s][0] = WPP[s], d = W[s] - WP2[s], dd = W[s] << 1, e = WPP[s] + d;
            for (uint p = 1; p < 256; p++, d += dd, e += d)
            {
                error[s][p] = e;
                if (e < best_error)
                {
                    best_error = e;
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 3; s; s--)
        {
            best_remaining_error[s - 1] += best_remaining_error[s];
        }
    }